

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_EmboldenXY(FT_Outline *outline,FT_Pos xstrength,FT_Pos ystrength)

{
  FT_Vector *pFVar1;
  bool bVar2;
  FT_UInt32 FVar3;
  int iVar4;
  FT_Long a_;
  ulong uVar5;
  FT_Long c_;
  int iVar6;
  int iVar7;
  FT_Error FVar8;
  ulong uVar9;
  long lVar10;
  FT_Long FVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  FT_Vector local_c0;
  long local_b0;
  ulong local_a8;
  FT_Orientation local_9c;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  ulong local_78;
  short *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  FT_Long local_48;
  long local_40;
  ulong local_38;
  
  if (outline == (FT_Outline *)0x0) {
    FVar8 = 0x14;
  }
  else {
    FVar8 = 0;
    if (2 < xstrength + 1U || 2 < ystrength + 1U) {
      local_9c = FT_Outline_Get_Orientation(outline);
      if (local_9c == FT_ORIENTATION_NONE) {
        FVar8 = 6;
        if (outline->n_contours == 0) {
          FVar8 = 0;
        }
      }
      else {
        local_68 = (long)outline->n_contours;
        FVar8 = 0;
        if (0 < local_68) {
          local_90 = xstrength / 2;
          local_98 = ystrength / 2;
          pFVar1 = outline->points;
          local_70 = outline->contours;
          local_50 = (long)(int)local_90;
          local_58 = (long)(int)local_98;
          local_60 = 0;
          iVar16 = 0;
          do {
            iVar15 = (int)local_70[local_60];
            if (iVar16 != iVar15 && iVar15 != -1) {
              iVar4 = -1;
              local_78 = 0;
              local_80 = 0;
              local_88 = 0;
              uVar9 = 0;
              lVar17 = 0;
              lVar12 = 0;
              iVar7 = iVar16;
              iVar6 = iVar15;
              do {
                if (iVar7 == iVar4) {
                  local_c0.x = local_80;
                  local_c0.y = local_88;
                  uVar5 = local_78;
LAB_0021af6c:
                  lVar10 = local_c0.x;
                  lVar14 = local_c0.y;
                  iVar13 = iVar7;
                  if (uVar9 != 0) {
                    if (iVar4 < 0) {
                      iVar4 = iVar6;
                      local_88 = lVar12;
                      local_80 = lVar17;
                      local_78 = uVar9;
                    }
                    local_b0 = (long)(int)lVar17;
                    lVar10 = (int)local_c0.x * local_b0;
                    lVar14 = (long)(int)local_c0.y * (long)(int)lVar12;
                    lVar10 = (long)(int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10) +
                             (long)(int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10);
                    local_a8 = uVar5;
                    if (lVar10 < -0xefff) {
                      lVar17 = 0;
                      FVar11 = 0;
                    }
                    else {
                      local_40 = lVar10 + 0x10000;
                      a_ = local_c0.x + lVar17;
                      FVar11 = -(local_c0.y + lVar12);
                      lVar17 = (long)(int)local_c0.x * (long)(int)lVar12;
                      local_b0 = (int)local_c0.y * local_b0;
                      lVar17 = (long)(int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10) -
                               (long)(int)((ulong)(local_b0 + 0x8000 + (local_b0 >> 0x3f)) >> 0x10);
                      local_48 = -lVar17;
                      if (local_9c != FT_ORIENTATION_FILL_RIGHT) {
                        local_48 = lVar17;
                        FVar11 = local_c0.y + lVar12;
                        a_ = -a_;
                      }
                      local_38 = uVar9;
                      if ((long)uVar5 <= (long)uVar9) {
                        local_38 = uVar5;
                      }
                      iVar13 = (int)local_48;
                      lVar17 = iVar13 * local_50;
                      lVar12 = (long)(int)local_40 * (long)(int)local_38;
                      local_b0 = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
                      c_ = local_40;
                      uVar9 = local_90;
                      if (local_b0 < (int)((ulong)(lVar17 + 0x8000 + (lVar17 >> 0x3f)) >> 0x10)) {
                        c_ = local_48;
                        uVar9 = local_38;
                      }
                      FVar11 = FT_MulDiv(FVar11,uVar9,c_);
                      lVar12 = iVar13 * local_58;
                      lVar17 = local_40;
                      uVar9 = local_98;
                      if (local_b0 < (int)((ulong)((lVar12 >> 0x3f) + lVar12 + 0x8000) >> 0x10)) {
                        lVar17 = local_48;
                        uVar9 = local_38;
                      }
                      lVar17 = FT_MulDiv(a_,uVar9,lVar17);
                    }
                    uVar5 = local_a8;
                    lVar10 = local_c0.x;
                    lVar14 = local_c0.y;
                    iVar13 = iVar6;
                    if (iVar6 != iVar7) {
                      do {
                        pFVar1[iVar6].x = pFVar1[iVar6].x + FVar11 + local_90;
                        pFVar1[iVar6].y = pFVar1[iVar6].y + lVar17 + local_98;
                        bVar2 = iVar15 <= iVar6;
                        iVar6 = iVar6 + 1;
                        if (bVar2) {
                          iVar6 = iVar16;
                        }
                        iVar13 = iVar6;
                      } while (iVar6 != iVar7);
                    }
                  }
                }
                else {
                  local_c0.x = pFVar1[iVar7].x - pFVar1[iVar6].x;
                  local_c0.y = pFVar1[iVar7].y - pFVar1[iVar6].y;
                  FVar3 = FT_Vector_NormLen(&local_c0);
                  uVar5 = uVar9;
                  lVar10 = lVar17;
                  lVar14 = lVar12;
                  iVar13 = iVar6;
                  if (FVar3 != 0) {
                    uVar5 = (ulong)FVar3;
                    goto LAB_0021af6c;
                  }
                }
                iVar6 = iVar13;
                bVar2 = iVar15 <= iVar7;
                iVar7 = iVar7 + 1;
                if (bVar2) {
                  iVar7 = iVar16;
                }
              } while ((iVar7 != iVar6) &&
                      (uVar9 = uVar5, lVar17 = lVar10, lVar12 = lVar14, iVar6 != iVar4));
            }
            iVar16 = iVar15 + 1;
            local_60 = local_60 + 1;
          } while (local_60 != local_68);
          FVar8 = 0;
        }
      }
    }
  }
  return FVar8;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_EmboldenXY( FT_Outline*  outline,
                         FT_Pos       xstrength,
                         FT_Pos       ystrength )
  {
    FT_Vector*      points;
    FT_Int          c, first, last;
    FT_Orientation  orientation;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    xstrength /= 2;
    ystrength /= 2;
    if ( xstrength == 0 && ystrength == 0 )
      return FT_Err_Ok;

    orientation = FT_Outline_Get_Orientation( outline );
    if ( orientation == FT_ORIENTATION_NONE )
    {
      if ( outline->n_contours )
        return FT_THROW( Invalid_Argument );
      else
        return FT_Err_Ok;
    }

    points = outline->points;

    first = 0;
    for ( c = 0; c < outline->n_contours; c++ )
    {
      FT_Vector  in, out, anchor, shift;
      FT_Fixed   l_in, l_out, l_anchor = 0, l, q, d;
      FT_Int     i, j, k;


      l_in = 0;
      last = outline->contours[c];

      /* pacify compiler */
      in.x = in.y = anchor.x = anchor.y = 0;

      /* Counter j cycles though the points; counter i advances only  */
      /* when points are moved; anchor k marks the first moved point. */
      for ( i = last, j = first, k = -1;
            j != i && i != k;
            j = j < last ? j + 1 : first )
      {
        if ( j != k )
        {
          out.x = points[j].x - points[i].x;
          out.y = points[j].y - points[i].y;
          l_out = (FT_Fixed)FT_Vector_NormLen( &out );

          if ( l_out == 0 )
            continue;
        }
        else
        {
          out   = anchor;
          l_out = l_anchor;
        }

        if ( l_in != 0 )
        {
          if ( k < 0 )
          {
            k        = i;
            anchor   = in;
            l_anchor = l_in;
          }

          d = FT_MulFix( in.x, out.x ) + FT_MulFix( in.y, out.y );

          /* shift only if turn is less than ~160 degrees */
          if ( d > -0xF000L )
          {
            d = d + 0x10000L;

            /* shift components along lateral bisector in proper orientation */
            shift.x = in.y + out.y;
            shift.y = in.x + out.x;

            if ( orientation == FT_ORIENTATION_TRUETYPE )
              shift.x = -shift.x;
            else
              shift.y = -shift.y;

            /* restrict shift magnitude to better handle collapsing segments */
            q = FT_MulFix( out.x, in.y ) - FT_MulFix( out.y, in.x );
            if ( orientation == FT_ORIENTATION_TRUETYPE )
              q = -q;

            l = FT_MIN( l_in, l_out );

            /* non-strict inequalities avoid divide-by-zero when q == l == 0 */
            if ( FT_MulFix( xstrength, q ) <= FT_MulFix( l, d ) )
              shift.x = FT_MulDiv( shift.x, xstrength, d );
            else
              shift.x = FT_MulDiv( shift.x, l, q );


            if ( FT_MulFix( ystrength, q ) <= FT_MulFix( l, d ) )
              shift.y = FT_MulDiv( shift.y, ystrength, d );
            else
              shift.y = FT_MulDiv( shift.y, l, q );
          }
          else
            shift.x = shift.y = 0;

          for ( ;
                i != j;
                i = i < last ? i + 1 : first )
          {
            points[i].x += xstrength + shift.x;
            points[i].y += ystrength + shift.y;
          }
        }
        else
          i = j;

        in   = out;
        l_in = l_out;
      }

      first = last + 1;
    }

    return FT_Err_Ok;
  }